

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validateNormalBlockElements(FunctionValidator *this,Block *curr)

{
  ExpressionList *this_00;
  Type left;
  Type right;
  bool bVar1;
  ulong uVar2;
  Expression **ppEVar3;
  ostream *poVar4;
  uint uVar5;
  ulong index;
  
  this_00 = &curr->list;
  uVar2 = (curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements;
  if (uVar2 < 2) {
    if (uVar2 == 0) goto LAB_00a3f0e5;
  }
  else {
    for (uVar5 = 0; index = (ulong)uVar5, index < uVar2 - 1; uVar5 = uVar5 + 1) {
      ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&this_00->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,index);
      bVar1 = shouldBeTrue<wasm::Block*>
                        (this,((*ppEVar3)->type).id < 2,curr,
                         "non-final block elements returning a value must be drop()ed (binaryen\'s autodrop option might help you)"
                        );
      if ((!bVar1) && (this->info->quiet == false)) {
        poVar4 = getStream(this);
        poVar4 = std::operator<<(poVar4,"(on index ");
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
        poVar4 = std::operator<<(poVar4,":\n");
        ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                  (&this_00->
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,index
                  );
        poVar4 = std::ostream::_M_insert<void_const*>(poVar4);
        poVar4 = std::operator<<(poVar4,"\n), type: ");
        ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&this_00->
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,index);
        poVar4 = wasm::operator<<(poVar4,(Type)((*ppEVar3)->type).id);
        std::operator<<(poVar4,"\n");
      }
      uVar2 = (curr->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements;
    }
  }
  ppEVar3 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                      (&this_00->
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
  left.id = ((*ppEVar3)->type).id;
  right.id = (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id;
  if (right.id < 2) {
    shouldBeFalse<wasm::Block*>
              (this,1 < left.id,curr,
               "if block is not returning a value, final element should not flow out a value");
  }
  else if (left.id < 2) {
    shouldBeUnequal<wasm::Block*,wasm::Type>
              (this,left,(Type)0x0,curr,"block with value must not have last element that is none");
  }
  else {
    shouldBeSubType(this,left,right,(Expression *)curr,
                    "block with value and last element with value must match types");
  }
LAB_00a3f0e5:
  if (1 < (curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id) {
    shouldBeTrue<wasm::Block*>
              (this,(curr->list).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                    usedElements != 0,curr,"block with a value must not be empty");
    return;
  }
  return;
}

Assistant:

void FunctionValidator::validateNormalBlockElements(Block* curr) {
  if (curr->list.size() > 1) {
    for (Index i = 0; i < curr->list.size() - 1; i++) {
      if (!shouldBeTrue(
            !curr->list[i]->type.isConcrete(),
            curr,
            "non-final block elements returning a value must be drop()ed "
            "(binaryen's autodrop option might help you)") &&
          !info.quiet) {
        getStream() << "(on index " << i << ":\n"
                    << curr->list[i] << "\n), type: " << curr->list[i]->type
                    << "\n";
      }
    }
  }
  if (curr->list.size() > 0) {
    auto backType = curr->list.back()->type;
    if (!curr->type.isConcrete()) {
      shouldBeFalse(backType.isConcrete(),
                    curr,
                    "if block is not returning a value, final element should "
                    "not flow out a value");
    } else {
      if (backType.isConcrete()) {
        shouldBeSubType(
          backType,
          curr->type,
          curr,
          "block with value and last element with value must match types");
      } else {
        shouldBeUnequal(
          backType,
          Type(Type::none),
          curr,
          "block with value must not have last element that is none");
      }
    }
  }
  if (curr->type.isConcrete()) {
    shouldBeTrue(
      curr->list.size() > 0, curr, "block with a value must not be empty");
  }
}